

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O0

UChar * ures_getStringByKeyWithFallback_63
                  (UResourceBundle *resB,char *inKey,int32_t *len,UErrorCode *status)

{
  UBool UVar1;
  int32_t local_104;
  UResourceBundle *pUStack_100;
  int32_t length;
  UChar *retVal;
  UResourceBundle stack;
  UErrorCode *status_local;
  int32_t *len_local;
  char *inKey_local;
  UResourceBundle *resB_local;
  
  pUStack_100 = (UResourceBundle *)0x0;
  stack._192_8_ = status;
  ures_initStackObject_63((UResourceBundle *)&retVal);
  ures_getByKeyWithFallback_63(resB,inKey,(UResourceBundle *)&retVal,(UErrorCode *)stack._192_8_);
  pUStack_100 = (UResourceBundle *)
                ures_getString_63((UResourceBundle *)&retVal,&local_104,(UErrorCode *)stack._192_8_)
  ;
  ures_close_63((UResourceBundle *)&retVal);
  UVar1 = U_FAILURE(*(UErrorCode *)stack._192_8_);
  if (UVar1 == '\0') {
    if ((((local_104 == 3) && (*(UChar *)&pUStack_100->fKey == L'∅')) &&
        (*(UChar *)((long)&pUStack_100->fKey + 2) == L'∅')) &&
       (*(UChar *)((long)&pUStack_100->fKey + 4) == L'∅')) {
      pUStack_100 = (UResourceBundle *)0x0;
      local_104 = 0;
      *(undefined4 *)stack._192_8_ = 2;
    }
    if (len != (int32_t *)0x0) {
      *len = local_104;
    }
    resB_local = pUStack_100;
  }
  else {
    resB_local = (UResourceBundle *)0x0;
  }
  return (UChar *)resB_local;
}

Assistant:

U_INTERNAL const UChar* U_EXPORT2 
ures_getStringByKeyWithFallback(const UResourceBundle *resB, 
                                const char* inKey, 
                                int32_t* len,
                                UErrorCode *status) {

    UResourceBundle stack;
    const UChar* retVal = NULL;
    ures_initStackObject(&stack);
    ures_getByKeyWithFallback(resB, inKey, &stack, status);
    int32_t length;
    retVal = ures_getString(&stack, &length, status);
    ures_close(&stack);
    if (U_FAILURE(*status)) {
        return NULL;
    }
    if (length == 3 && retVal[0] == EMPTY_SET && retVal[1] == EMPTY_SET && retVal[2] == EMPTY_SET ) {
        retVal = NULL;
        length = 0;
        *status = U_MISSING_RESOURCE_ERROR;
    }
    if (len != NULL) {
        *len = length;
    }
    return retVal;
}